

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

void xmlTextReaderValidateEntity(xmlTextReaderPtr reader)

{
  xmlNodePtr pxVar1;
  xmlChar *data;
  xmlNodePtr cur;
  int len;
  bool local_3a;
  bool local_39;
  xmlNodePtr tmp;
  xmlNodePtr node;
  xmlNodePtr oldnode;
  xmlTextReaderPtr reader_local;
  
  pxVar1 = reader->node;
  tmp = reader->node;
  do {
    if (tmp->type == XML_ENTITY_REF_NODE) {
      if (((tmp->children == (_xmlNode *)0x0) || (tmp->children->type != XML_ENTITY_DECL)) ||
         (tmp->children->children == (_xmlNode *)0x0)) {
        if (tmp == pxVar1) break;
LAB_001f0a18:
        if (tmp->next == (_xmlNode *)0x0) {
          do {
            tmp = tmp->parent;
            if (tmp->type == XML_ELEMENT_NODE) {
              if (reader->entNr == 0) {
                while ((cur = tmp->last, cur != (xmlNodePtr)0x0 && ((cur->extra & 2) == 0))) {
                  xmlUnlinkNode(cur);
                  xmlTextReaderFreeNode(reader,cur);
                }
              }
              reader->node = tmp;
              xmlTextReaderValidatePop(reader);
            }
            if (((tmp->type == XML_ENTITY_DECL) && (reader->ent != (xmlNodePtr)0x0)) &&
               (reader->ent->children == tmp)) {
              tmp = xmlTextReaderEntPop(reader);
            }
            if (tmp == pxVar1) break;
            if (tmp->next != (_xmlNode *)0x0) {
              tmp = tmp->next;
              break;
            }
            local_39 = tmp != (xmlNodePtr)0x0 && tmp != pxVar1;
          } while (local_39);
        }
        else {
          tmp = tmp->next;
        }
      }
      else {
        xmlTextReaderEntPush(reader,tmp);
        tmp = tmp->children->children;
      }
    }
    else {
      if (tmp->type == XML_ELEMENT_NODE) {
        reader->node = tmp;
        xmlTextReaderValidatePush(reader);
      }
      else if ((tmp->type == XML_TEXT_NODE) || (tmp->type == XML_CDATA_SECTION_NODE)) {
        data = tmp->content;
        len = xmlStrlen(tmp->content);
        xmlTextReaderValidateCData(reader,data,len);
      }
      if (tmp->children == (_xmlNode *)0x0) {
        if (tmp->type == XML_ELEMENT_NODE) {
          xmlTextReaderValidatePop(reader);
        }
        goto LAB_001f0a18;
      }
      tmp = tmp->children;
    }
    local_3a = tmp != (xmlNodePtr)0x0 && tmp != pxVar1;
  } while (local_3a);
  reader->node = pxVar1;
  return;
}

Assistant:

static void
xmlTextReaderValidateEntity(xmlTextReaderPtr reader) {
    xmlNodePtr oldnode = reader->node;
    xmlNodePtr node = reader->node;

    do {
	if (node->type == XML_ENTITY_REF_NODE) {
	    if ((node->children != NULL) &&
		(node->children->type == XML_ENTITY_DECL) &&
		(node->children->children != NULL)) {
		xmlTextReaderEntPush(reader, node);
		node = node->children->children;
		continue;
	    } else {
		/*
		 * The error has probably been raised already.
		 */
		if (node == oldnode)
		    break;
                goto skip_children;
	    }
#ifdef LIBXML_REGEXP_ENABLED
	} else if (node->type == XML_ELEMENT_NODE) {
	    reader->node = node;
	    xmlTextReaderValidatePush(reader);
	} else if ((node->type == XML_TEXT_NODE) ||
		   (node->type == XML_CDATA_SECTION_NODE)) {
            xmlTextReaderValidateCData(reader, node->content,
	                               xmlStrlen(node->content));
#endif
	}

	/*
	 * go to next node
	 */
	if (node->children != NULL) {
	    node = node->children;
	    continue;
	} else if (node->type == XML_ELEMENT_NODE) {
	    xmlTextReaderValidatePop(reader);
	}
skip_children:
	if (node->next != NULL) {
	    node = node->next;
	    continue;
	}
	do {
	    node = node->parent;
	    if (node->type == XML_ELEMENT_NODE) {
	        xmlNodePtr tmp;
		if (reader->entNr == 0) {
		    while ((tmp = node->last) != NULL) {
			if ((tmp->extra & NODE_IS_PRESERVED) == 0) {
			    xmlUnlinkNode(tmp);
			    xmlTextReaderFreeNode(reader, tmp);
			} else
			    break;
		    }
		}
		reader->node = node;
		xmlTextReaderValidatePop(reader);
	    }
	    if ((node->type == XML_ENTITY_DECL) &&
		(reader->ent != NULL) && (reader->ent->children == node)) {
		node = xmlTextReaderEntPop(reader);
	    }
	    if (node == oldnode)
		break;
	    if (node->next != NULL) {
		node = node->next;
		break;
	    }
	} while ((node != NULL) && (node != oldnode));
    } while ((node != NULL) && (node != oldnode));
    reader->node = oldnode;
}